

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall xray_re::xr_vbuf::xr_vbuf(xr_vbuf *this,xr_vbuf *that)

{
  size_t size;
  _vector3<float> *p_Var1;
  _vector2<float> *p_Var2;
  _color<float> *p_Var3;
  _influence<unsigned_int,_float> *p_Var4;
  xr_vbuf *that_local;
  xr_vbuf *this_local;
  
  xr_flexbuf::xr_flexbuf(&this->super_xr_flexbuf,&that->super_xr_flexbuf);
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_vbuf_0038c748;
  xr_flexbuf::set_owner(&this->super_xr_flexbuf,true);
  size = xr_flexbuf::size(&that->super_xr_flexbuf);
  xr_flexbuf::set_size(&this->super_xr_flexbuf,size);
  p_Var1 = xr_flexbuf::duplicate<xray_re::_vector3<float>>(&this->super_xr_flexbuf,that->m_points);
  this->m_points = p_Var1;
  p_Var1 = xr_flexbuf::duplicate<xray_re::_vector3<float>>(&this->super_xr_flexbuf,that->m_normals);
  this->m_normals = p_Var1;
  p_Var2 = xr_flexbuf::duplicate<xray_re::_vector2<float>>
                     (&this->super_xr_flexbuf,that->m_texcoords);
  this->m_texcoords = p_Var2;
  p_Var2 = xr_flexbuf::duplicate<xray_re::_vector2<float>>
                     (&this->super_xr_flexbuf,that->m_lightmaps);
  this->m_lightmaps = p_Var2;
  p_Var3 = xr_flexbuf::duplicate<xray_re::_color<float>>(&this->super_xr_flexbuf,that->m_colors);
  this->m_colors = p_Var3;
  p_Var4 = xr_flexbuf::duplicate<xray_re::_influence<unsigned_int,float>>
                     (&this->super_xr_flexbuf,that->m_influences);
  this->m_influences = p_Var4;
  make_signature(this);
  return;
}

Assistant:

xr_vbuf::xr_vbuf(const xr_vbuf& that): xr_flexbuf(that)
{
	set_owner(true);
	set_size(that.size());
	m_points = duplicate(that.m_points);
	m_normals = duplicate(that.m_normals);
	m_texcoords = duplicate(that.m_texcoords);
	m_lightmaps = duplicate(that.m_lightmaps);
	m_colors = duplicate(that.m_colors);
	m_influences = duplicate(that.m_influences);
	make_signature();
}